

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rest.cpp
# Opt level: O1

ChainstateManager * GetChainman(any *context,HTTPRequest *req)

{
  NodeContext *pNVar1;
  ChainstateManager *pCVar2;
  long in_FS_OFFSET;
  char (*in_stack_ffffffffffffffb8) [42];
  char local_3c [4];
  string local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pNVar1 = util::AnyPtr<node::NodeContext>(context);
  if ((pNVar1 == (NodeContext *)0x0) ||
     (pCVar2 = (pNVar1->chainman)._M_t.
               super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>.
               _M_t.
               super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>.
               super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl,
     pCVar2 == (ChainstateManager *)0x0)) {
    local_3c[0] = -0x7d;
    local_3c[1] = '\0';
    local_3c[2] = '\0';
    local_3c[3] = '\0';
    tinyformat::format<char[89],int,char[12],char[42]>
              (&local_38,
               (tinyformat *)
               "%s:%d (%s)\nInternal bug detected: Chainman disabled or instance not found!\nYou may report this issue here: %s\n"
               ,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rest.cpp"
               ,(char (*) [89])local_3c,(int *)"GetChainman",
               (char (*) [12])"https://github.com/bitcoin/bitcoin/issues",in_stack_ffffffffffffffb8)
    ;
    RESTERR(req,HTTP_INTERNAL_SERVER_ERROR,&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
    pCVar2 = (ChainstateManager *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return pCVar2;
  }
  __stack_chk_fail();
}

Assistant:

static ChainstateManager* GetChainman(const std::any& context, HTTPRequest* req)
{
    auto node_context = util::AnyPtr<NodeContext>(context);
    if (!node_context || !node_context->chainman) {
        RESTERR(req, HTTP_INTERNAL_SERVER_ERROR,
                strprintf("%s:%d (%s)\n"
                          "Internal bug detected: Chainman disabled or instance not found!\n"
                          "You may report this issue here: %s\n",
                          __FILE__, __LINE__, __func__, PACKAGE_BUGREPORT));
        return nullptr;
    }
    return node_context->chainman.get();
}